

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double ddCountPathsToNonZero(DdNode *N,st__table *table)

{
  bool bVar1;
  int iVar2;
  char *local_60;
  double *dummy;
  double paths2;
  double paths1;
  double *ppaths;
  double paths;
  DdNode *Ne;
  DdNode *Nt;
  DdNode *node;
  st__table *table_local;
  DdNode *N_local;
  
  Nt = (DdNode *)((ulong)N & 0xfffffffffffffffe);
  if (Nt->index == 0x7fffffff) {
    bVar1 = true;
    if (((ulong)N & 1) == 0) {
      bVar1 = (Nt->type).value == 0.0;
    }
    N_local = (DdNode *)(double)(bVar1 ^ 1);
  }
  else {
    node = (DdNode *)table;
    table_local = (st__table *)N;
    iVar2 = st__lookup(table,(char *)N,&local_60);
    if (iVar2 == 0) {
      Ne = (Nt->type).kids.T;
      paths = (double)(Nt->type).kids.E;
      if ((st__table *)Nt != table_local) {
        Ne = (DdNode *)((ulong)Ne ^ 1);
        paths = (double)((ulong)paths ^ 1);
      }
      paths2 = ddCountPathsToNonZero(Ne,(st__table *)node);
      if ((paths2 != -1.0) || (NAN(paths2))) {
        dummy = (double *)ddCountPathsToNonZero((DdNode *)paths,(st__table *)node);
        if (((double)dummy != -1.0) || (NAN((double)dummy))) {
          ppaths = (double *)(paths2 + (double)dummy);
          paths1 = (double)malloc(8);
          if ((char *)paths1 == (char *)0x0) {
            N_local = (DdNode *)0xbff0000000000000;
          }
          else {
            *(double **)paths1 = ppaths;
            iVar2 = st__add_direct((st__table *)node,(char *)table_local,(char *)paths1);
            if (iVar2 == -10000) {
              if (paths1 != 0.0) {
                free((void *)paths1);
              }
              N_local = (DdNode *)0xbff0000000000000;
            }
            else {
              N_local = (DdNode *)ppaths;
            }
          }
        }
        else {
          N_local = (DdNode *)0xbff0000000000000;
        }
      }
      else {
        N_local = (DdNode *)0xbff0000000000000;
      }
    }
    else {
      N_local = *(DdNode **)local_60;
    }
  }
  return (double)N_local;
}

Assistant:

static double
ddCountPathsToNonZero(
  DdNode * N,
  st__table * table)
{

    DdNode      *node, *Nt, *Ne;
    double      paths, *ppaths, paths1, paths2;
    double      *dummy;

    node = Cudd_Regular(N);
    if (cuddIsConstant(node)) {
        return((double) !(Cudd_IsComplement(N) || cuddV(node)==DD_ZERO_VAL));
    }
    if ( st__lookup(table, (const char *)N, (char **)&dummy)) {
        paths = *dummy;
        return(paths);
    }

    Nt = cuddT(node); Ne = cuddE(node);
    if (node != N) {
        Nt = Cudd_Not(Nt); Ne = Cudd_Not(Ne);
    }

    paths1 = ddCountPathsToNonZero(Nt,table);
    if (paths1 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths2 = ddCountPathsToNonZero(Ne,table);
    if (paths2 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths = paths1 + paths2;

    ppaths = ABC_ALLOC(double,1);
    if (ppaths == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }

    *ppaths = paths;

    if ( st__add_direct(table,(char *)N, (char *)ppaths) == st__OUT_OF_MEM) {
        ABC_FREE(ppaths);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(paths);

}